

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::InvariantOuterEdge::OuterEdgeDivisionTestInstance::iterate
          (TestStatus *__return_storage_ptr__,OuterEdgeDivisionTestInstance *this)

{
  OuterEdgeDescription *edgeDesc;
  float *pfVar1;
  ostringstream *this_00;
  ostringstream *this_01;
  ostream *poVar2;
  float fVar3;
  pointer pOVar4;
  VkDevice pVVar5;
  bool bVar6;
  long lVar7;
  int iVar8;
  deInt32 dVar9;
  float *pfVar10;
  bool bVar11;
  bool usePointMode;
  bool bVar12;
  float *pfVar13;
  undefined1 usePointMode_00;
  bool bVar14;
  int iVar15;
  VkAllocationCallbacks *pVVar16;
  float *outer;
  DeviceInterface *pDVar17;
  int iVar18;
  bool bVar19;
  ulong uVar20;
  BaseTestInstance *__last1;
  pointer pPVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  vector<float,_std::allocator<float>_> patchTessLevels;
  Vec3Set outerEdgeVertices;
  Vec3Set firstOuterEdgeVertices;
  DrawResult result;
  Winding local_34c;
  undefined1 local_318 [32];
  string local_2f8;
  BaseTestInstance *local_2d8;
  Winding local_2cc;
  vector<float,_std::allocator<float>_> local_2c8;
  undefined1 local_2b0 [32];
  long local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  string *local_280;
  undefined1 local_278 [32];
  undefined1 local_258 [16];
  _Base_ptr local_248;
  _Rb_tree_const_iterator<tcu::Vector<float,_3>_> local_240;
  _Base_ptr local_238;
  size_t local_230;
  set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
  local_228;
  DeviceInterface *local_1f8;
  VkDevice local_1f0;
  VkAllocationCallbacks *local_1e8;
  Allocation *local_1e0;
  DrawResult local_1d8;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [368];
  
  if (0 < (int)((ulong)((long)(this->super_BaseTestInstance).m_edgeDescriptions.
                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_BaseTestInstance).m_edgeDescriptions.
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    local_280 = (string *)&__return_storage_ptr__->m_description;
    local_288 = &(__return_storage_ptr__->m_description).field_2;
    local_290 = 8;
    pDVar17 = (DeviceInterface *)0x0;
    local_2d8 = &this->super_BaseTestInstance;
    do {
      local_1f0 = (VkDevice)((long)pDVar17 << 4);
      pVVar16 = (VkAllocationCallbacks *)0x0;
      local_1f8 = pDVar17;
      do {
        pOVar4 = (this->super_BaseTestInstance).m_edgeDescriptions.
                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        fVar3 = (float)(&tessellation::(anonymous_namespace)::InvariantOuterEdge::BaseTestInstance::
                         m_singleOuterEdgeLevels)[(long)pVVar16];
        local_1e8 = pVVar16;
        generatePatchTessLevels
                  (&local_2c8,(this->super_BaseTestInstance).m_numPatchesToDraw,(int)local_1f8,fVar3
                  );
        local_228._M_t._M_impl._0_1_ = 0;
        local_228._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_228._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_228._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_228._M_t._M_impl.super__Rb_tree_header._M_header;
        local_228._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_228._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_228._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        BaseTestInstance::uploadVertexAttributes(&this->super_BaseTestInstance,&local_2c8);
        edgeDesc = (OuterEdgeDescription *)(local_1f0 + (long)pOVar4);
        logOuterTessellationLevel
                  (((this->super_BaseTestInstance).super_TestInstance.m_context)->m_testCtx->m_log,
                   fVar3,edgeDesc);
        lVar7 = local_290;
        local_34c = WINDING_CCW;
        bVar11 = true;
        do {
          bVar6 = bVar11;
          usePointMode = false;
          bVar11 = false;
          bVar12 = true;
          do {
            bVar19 = bVar12;
            local_2cc = (Winding)usePointMode;
            uVar23 = (ulong)local_2cc;
            __last1 = &this->super_BaseTestInstance;
            BaseTestInstance::draw
                      (&local_1d8,&this->super_BaseTestInstance,
                       (deUint32)
                       ((ulong)((long)local_2c8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2c8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start) >> 2),&local_2c8,
                       local_34c,usePointMode);
            pPVar21 = local_1d8.primitives.
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            dVar9 = local_1d8.numPrimitives;
            iVar8 = local_1d8.numPrimitiveVertices;
            if (local_1d8.success == true) {
              bVar14 = true;
              if (0 < (this->super_BaseTestInstance).m_numPatchesToDraw) {
                uVar20 = (ulong)(uint)local_1d8.numPrimitiveVertices;
                iVar15 = 0;
                iVar18 = 0;
                do {
                  local_1e0 = (Allocation *)
                              local_2c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start;
                  local_258[0] = 0;
                  local_258._8_4_ = _S_red;
                  outer = (float *)0x0;
                  local_248 = (_Base_ptr)0x0;
                  local_240._M_node = (_Base_ptr)(local_258 + 8);
                  local_230 = 0;
                  iVar22 = iVar18;
                  local_238 = local_240._M_node;
                  if (iVar18 < dVar9) {
                    do {
                      iVar22 = iVar18;
                      if (pPVar21[iVar18].patchPrimitiveID != iVar15) break;
                      if (0 < iVar8) {
                        uVar24 = 0;
                        do {
                          local_1b0._0_8_ =
                               *(BaseTestInstance **)pPVar21[iVar18].tessCoord[uVar24].m_data;
                          local_1b0._8_4_ = pPVar21[iVar18].tessCoord[uVar24].m_data[2];
                          pfVar13 = (float *)(long)edgeDesc->numConstantCoordinateValueChoices;
                          if (0 < (long)pfVar13) {
                            outer = (float *)(long)edgeDesc->constantCoordinateIndex;
                            fVar3 = *(float *)(local_1b0 + (long)outer * 4);
                            if ((fVar3 != edgeDesc->constantCoordinateValueChoices[0]) ||
                               (NAN(fVar3) || NAN(edgeDesc->constantCoordinateValueChoices[0]))) {
                              pfVar10 = (float *)&DAT_00000001;
                              do {
                                outer = pfVar10;
                                if (pfVar13 == outer) break;
                                pfVar1 = (float *)((long)pOVar4->constantCoordinateValueChoices +
                                                  lVar7 + (long)outer * 4 + -8);
                                pfVar10 = (float *)((long)outer + 1);
                              } while ((fVar3 != *pfVar1) || (NAN(fVar3) || NAN(*pfVar1)));
                              if (pfVar13 <= outer) goto LAB_00770712;
                            }
                            std::
                            set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ::insert((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                      *)local_258,(value_type *)local_1b0);
                          }
LAB_00770712:
                          uVar24 = uVar24 + 1;
                        } while (uVar24 != uVar20);
                      }
                      iVar18 = iVar18 + 1;
                      iVar22 = dVar9;
                    } while (iVar18 != dVar9);
                  }
                  iVar18 = iVar22;
                  iVar22 = (int)uVar23;
                  if ((bVar11 || local_34c != WINDING_CCW) || iVar15 != 0) {
                    if (local_228._M_t._M_impl.super__Rb_tree_header._M_node_count == local_230) {
                      __last1 = (BaseTestInstance *)&local_228._M_t._M_impl.super__Rb_tree_header;
                      bVar12 = std::__equal<false>::
                               equal<std::_Rb_tree_const_iterator<tcu::Vector<float,3>>,std::_Rb_tree_const_iterator<tcu::Vector<float,3>>>
                                         ((_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)
                                          local_228._M_t._M_impl.super__Rb_tree_header._M_header.
                                          _M_left,(_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)
                                                  __last1,local_240);
                      iVar22 = (int)uVar23;
                      if (bVar12) goto LAB_00770792;
                    }
                    this = (OuterEdgeDivisionTestInstance *)local_2d8;
                    pVVar5 = (VkDevice)((local_2d8->super_TestInstance).m_context)->m_testCtx->m_log
                    ;
                    this_00 = (ostringstream *)(local_1b0 + 8);
                    local_1b0._0_8_ = pVVar5;
                    std::__cxx11::ostringstream::ostringstream(this_00);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,
                               "Failure: vertices generated for the edge differ between the following cases:\n"
                               ,0x4d);
                    this_01 = (ostringstream *)(local_1b0 + 8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,"  - case A: ",0xc);
                    tessellation::(anonymous_namespace)::getProgramDescription_abi_cxx11_
                              (&local_2f8,(_anonymous_namespace_ *)0x0,WINDING_CCW,SUB81(outer,0));
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_1b0 + 8),local_2f8._M_dataplus._M_p,
                               local_2f8._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_1b0 + 8),", tessellation levels: ",0x17);
                    getTessellationLevelsString_abi_cxx11_
                              ((string *)local_318,
                               (tessellation *)
                               local_2c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start,
                               (float *)((long)local_2c8.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_start + 8),outer);
                    usePointMode_00 = SUB81(outer,0);
                    poVar2 = (ostream *)(local_1b0 + 8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar2,(char *)local_318._0_8_,local_318._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  - case B: ",0xc);
                    tessellation::(anonymous_namespace)::getProgramDescription_abi_cxx11_
                              ((string *)local_2b0,(_anonymous_namespace_ *)(ulong)local_34c,
                               local_2cc,(bool)usePointMode_00);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_1b0 + 8),(char *)local_2b0._0_8_,local_2b0._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_1b0 + 8),", tessellation levels: ",0x17);
                    getTessellationLevelsString_abi_cxx11_
                              ((string *)local_278,
                               (tessellation *)
                               ((long)&local_1e0->_vptr_Allocation + (long)(iVar15 * 6) * 4),
                               (float *)((long)&local_1e0->_vptr_Allocation +
                                        (long)(iVar15 * 6 + 2) * 4),
                               (float *)(ulong)(uint)(iVar15 * 2));
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_1b0 + 8),(char *)local_278._0_8_,local_278._8_8_);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    if ((_Base_ptr)local_278._0_8_ != (_Base_ptr)(local_278 + 0x10)) {
                      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
                    }
                    if ((_Base_ptr)local_2b0._0_8_ != (_Base_ptr)(local_2b0 + 0x10)) {
                      operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
                    }
                    if ((_Base_ptr)local_318._0_8_ != (_Base_ptr)(local_318 + 0x10)) {
                      operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                      operator_delete(local_2f8._M_dataplus._M_p,
                                      local_2f8.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
                    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x68));
                    local_1b0._0_8_ = pVVar5;
                    std::__cxx11::ostringstream::ostringstream(this_01);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_01,
                               "Note: resulting vertices for the edge for the cases were:\n",0x3a);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_01,"  - case A: ",0xc);
                    local_318._0_8_ = local_228._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                    ;
                    local_2b0._0_8_ = &local_228._M_t._M_impl.super__Rb_tree_header;
                    elemsStr<std::_Rb_tree_const_iterator<tcu::Vector<float,3>>>
                              (&local_2f8,(tessellation *)local_318,
                               (_Rb_tree_const_iterator<tcu::Vector<float,_3>_> *)local_2b0,
                               (_Rb_tree_const_iterator<tcu::Vector<float,_3>_> *)0x5,0xe,iVar22);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_01,local_2f8._M_dataplus._M_p,
                               local_2f8._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_01,"  - case B: ",0xc);
                    local_2b0._0_8_ = local_240._M_node;
                    local_278._0_8_ = local_258 + 8;
                    elemsStr<std::_Rb_tree_const_iterator<tcu::Vector<float,3>>>
                              ((string *)local_318,(tessellation *)local_2b0,
                               (_Rb_tree_const_iterator<tcu::Vector<float,_3>_> *)local_278,
                               (_Rb_tree_const_iterator<tcu::Vector<float,_3>_> *)0x5,0xe,iVar22);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_01,(char *)local_318._0_8_,local_318._8_8_);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    if ((_Base_ptr)local_318._0_8_ != (_Base_ptr)(local_318 + 0x10)) {
                      operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                      operator_delete(local_2f8._M_dataplus._M_p,
                                      local_2f8.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream(this_01);
                    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x68));
                    local_1b0._0_8_ = local_1a0;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1b0,"Invalid set of vertices","");
                    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
                    (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_288;
                    __last1 = (BaseTestInstance *)local_1b0._0_8_;
                    std::__cxx11::string::_M_construct<char*>
                              (local_280,local_1b0._0_8_,
                               (long)&((TestInstance *)local_1b0._0_8_)->_vptr_TestInstance +
                               CONCAT44(local_1b0._12_4_,local_1b0._8_4_));
                    if ((BaseTestInstance *)local_1b0._0_8_ != (BaseTestInstance *)local_1a0) {
                      __last1 = (BaseTestInstance *)((long)(_func_int ***)local_1a0._0_8_ + 1);
                      operator_delete((void *)local_1b0._0_8_,(ulong)__last1);
                    }
                    std::
                    _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                *)local_248,(_Link_type)__last1);
                    bVar14 = false;
                    goto LAB_00770cc1;
                  }
                  __last1 = (BaseTestInstance *)local_258;
                  std::
                  set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ::operator=(&local_228,
                              (set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               *)__last1);
LAB_00770792:
                  std::
                  _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)local_248,(_Link_type)__last1);
                  iVar15 = iVar15 + 1;
                } while (iVar15 < local_2d8->m_numPatchesToDraw);
                bVar14 = true;
                this = (OuterEdgeDivisionTestInstance *)local_2d8;
              }
            }
            else {
              local_1b0._0_8_ = local_1a0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1b0,"Invalid set of vertices","");
              __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
              (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_288;
              __last1 = (BaseTestInstance *)local_1b0._0_8_;
              std::__cxx11::string::_M_construct<char*>
                        (local_280,local_1b0._0_8_,
                         (long)&((TestInstance *)local_1b0._0_8_)->_vptr_TestInstance +
                         CONCAT44(local_1b0._12_4_,local_1b0._8_4_));
              if ((BaseTestInstance *)local_1b0._0_8_ != (BaseTestInstance *)local_1a0) {
                __last1 = (BaseTestInstance *)((long)(_func_int ***)local_1a0._0_8_ + 1);
                operator_delete((void *)local_1b0._0_8_,(ulong)__last1);
              }
              bVar14 = false;
              pPVar21 = local_1d8.primitives.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
LAB_00770cc1:
            if (pPVar21 != (pointer)0x0) {
              __last1 = (BaseTestInstance *)
                        ((long)local_1d8.primitives.
                               super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar21);
              operator_delete(pPVar21,(ulong)__last1);
            }
            if (!bVar14) goto LAB_00770d12;
            bVar11 = true;
            usePointMode = true;
            bVar12 = false;
          } while (bVar19);
          local_34c = WINDING_CW;
          bVar11 = false;
        } while (bVar6);
LAB_00770d12:
        std::
        _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    *)local_228._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                   (_Link_type)__last1);
        if ((Allocation *)
            local_2c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (Allocation *)0x0) {
          operator_delete(local_2c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_2c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (!bVar14) {
          return __return_storage_ptr__;
        }
        pVVar16 = (VkAllocationCallbacks *)((long)&local_1e8->pUserData + 1);
      } while (pVVar16 != (VkAllocationCallbacks *)0xc);
      pDVar17 = (DeviceInterface *)((long)&local_1f8->_vptr_DeviceInterface + 1);
      local_290 = local_290 + 0x10;
    } while ((long)pDVar17 <
             (long)(int)((ulong)((long)(this->super_BaseTestInstance).m_edgeDescriptions.
                                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->super_BaseTestInstance).m_edgeDescriptions.
                                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4));
  }
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"OK","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1b0._0_8_,
             (VkDevice)(local_1b0._0_8_ + CONCAT44(local_1b0._12_4_,local_1b0._8_4_)));
  if ((VkDevice)local_1b0._0_8_ != (VkDevice)local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(ulong)((long)(_func_int ***)local_1a0._0_8_ + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus OuterEdgeDivisionTestInstance::iterate (void)
{
	for (int outerEdgeIndex = 0; outerEdgeIndex < static_cast<int>(m_edgeDescriptions.size()); ++outerEdgeIndex)
	for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(m_singleOuterEdgeLevels); ++outerEdgeLevelCaseNdx)
	{
		const OuterEdgeDescription& edgeDesc        = m_edgeDescriptions[outerEdgeIndex];
		const std::vector<float>    patchTessLevels = generatePatchTessLevels(m_numPatchesToDraw, outerEdgeIndex, m_singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);

		Vec3Set firstOuterEdgeVertices; // Vertices of the outer edge of the first patch of the first program's draw call; used for comparison with other patches.

		uploadVertexAttributes(patchTessLevels);
		logOuterTessellationLevel(m_context.getTestContext().getLog(), m_singleOuterEdgeLevels[outerEdgeLevelCaseNdx], edgeDesc);

		for (int windingNdx = 0; windingNdx < WINDING_LAST; ++windingNdx)
		for (int usePointModeNdx = 0; usePointModeNdx <= 1; ++usePointModeNdx)
		{
			const Winding winding	     = static_cast<Winding>(windingNdx);
			const bool	  usePointMode   = (usePointModeNdx != 0);
			const bool    isFirstProgram = (windingNdx == 0 && usePointModeNdx == 0);

			const DrawResult result = draw(static_cast<deUint32>(patchTessLevels.size()), patchTessLevels, winding, usePointMode);

			if (!result.success)
				return tcu::TestStatus::fail("Invalid set of vertices");

			// Check the vertices of each patch.

			int primitiveNdx = 0;
			for (int patchNdx = 0; patchNdx < m_numPatchesToDraw; ++patchNdx)
			{
				DE_ASSERT(primitiveNdx < result.numPrimitives);

				const float* const	innerLevels	= &patchTessLevels[NUM_TESS_LEVELS*patchNdx + 0];
				const float* const	outerLevels	= &patchTessLevels[NUM_TESS_LEVELS*patchNdx + 2];

				Vec3Set outerEdgeVertices;

				// We're interested in just the vertices on the current outer edge.
				for (; primitiveNdx < result.numPrimitives && result.primitives[primitiveNdx].patchPrimitiveID == patchNdx; ++primitiveNdx)
				for (int i = 0; i < result.numPrimitiveVertices; ++i)
				{
					const tcu::Vec3& coord = result.primitives[primitiveNdx].tessCoord[i].swizzle(0, 1, 2);
					if (edgeDesc.contains(coord))
						outerEdgeVertices.insert(coord);
				}

				// Compare the vertices to those of the first patch (unless this is the first patch).

				if (isFirstProgram && patchNdx == 0)
					firstOuterEdgeVertices = outerEdgeVertices;
				else if (firstOuterEdgeVertices != outerEdgeVertices)
				{
					tcu::TestLog& log = m_context.getTestContext().getLog();

					log << tcu::TestLog::Message
						<< "Failure: vertices generated for the edge differ between the following cases:\n"
						<< "  - case A: " << getProgramDescription((Winding)0, (bool)0) << ", tessellation levels: "
						<< getTessellationLevelsString(&patchTessLevels[0], &patchTessLevels[2]) << "\n"
						<< "  - case B: " << getProgramDescription(winding, usePointMode) << ", tessellation levels: "
						<< getTessellationLevelsString(innerLevels, outerLevels)
						<< tcu::TestLog::EndMessage;

					log << tcu::TestLog::Message
						<< "Note: resulting vertices for the edge for the cases were:\n"
						<< "  - case A: " << containerStr(firstOuterEdgeVertices, 5, 14) << "\n"
						<< "  - case B: " << containerStr(outerEdgeVertices, 5, 14)
						<< tcu::TestLog::EndMessage;

					return tcu::TestStatus::fail("Invalid set of vertices");
				}
			}
			DE_ASSERT(primitiveNdx == result.numPrimitives);
		} // for windingNdx, usePointModeNdx
	} // for outerEdgeIndex, outerEdgeLevelCaseNdx

	return tcu::TestStatus::pass("OK");
}